

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O3

void __thiscall
duckdb::ModeFunction<duckdb::ModeStandard<duckdb::hugeint_t>_>::
UpdateWindowState<duckdb::ModeState<duckdb::hugeint_t,_duckdb::ModeStandard<duckdb::hugeint_t>_>,_duckdb::hugeint_t>
::Right(UpdateWindowState<duckdb::ModeState<duckdb::hugeint_t,_duckdb::ModeStandard<duckdb::hugeint_t>_>,_duckdb::hugeint_t>
        *this,idx_t begin,idx_t end)

{
  DataChunk *result;
  unsigned_long *puVar1;
  ModeState<duckdb::hugeint_t,_duckdb::ModeStandard<duckdb::hugeint_t>_> *pMVar2;
  ColumnDataScanState *state;
  reference pvVar3;
  ulong uVar4;
  ValidityMask *pVVar5;
  
  if (begin < end) {
    do {
      puVar1 = (this->included->fmask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if ((puVar1 == (unsigned_long *)0x0) || ((puVar1[begin >> 6] >> (begin & 0x3f) & 1) != 0)) {
        pMVar2 = this->included->state;
        state = pMVar2->scan;
        if ((begin < state->next_row_index) && (uVar4 = state->current_row_index, uVar4 <= begin)) {
          pVVar5 = pMVar2->validity;
        }
        else {
          result = &pMVar2->page;
          ColumnDataCollection::Seek(pMVar2->inputs,begin,state,result);
          pvVar3 = vector<duckdb::Vector,_true>::operator[](&result->data,0);
          pMVar2->data = (hugeint_t *)pvVar3->data;
          pvVar3 = vector<duckdb::Vector,_true>::operator[](&result->data,0);
          FlatVector::VerifyFlatVector(pvVar3);
          pVVar5 = &pvVar3->validity;
          pMVar2->validity = pVVar5;
          uVar4 = pMVar2->scan->current_row_index;
        }
        puVar1 = (pVVar5->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if ((puVar1 == (unsigned_long *)0x0) ||
           ((puVar1[begin - uVar4 >> 6 & 0x3ffffff] >> (begin - uVar4 & 0x3f) & 1) != 0)) {
          ModeState<duckdb::hugeint_t,_duckdb::ModeStandard<duckdb::hugeint_t>_>::ModeAdd
                    (this->state,begin);
        }
      }
      begin = begin + 1;
    } while (end != begin);
  }
  return;
}

Assistant:

inline void Right(idx_t begin, idx_t end) {
			for (; begin < end; ++begin) {
				if (included(begin)) {
					state.ModeAdd(begin);
				}
			}
		}